

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

void __thiscall
gl3cts::TransformFeedback::CaptureVertexInterleaved::buildProgram(CaptureVertexInterleaved *this)

{
  int iVar1;
  uint uVar2;
  GLuint GVar3;
  undefined4 extraout_var;
  undefined4 *puVar4;
  GLint i;
  GLint i_00;
  GLint i_01;
  GLint i_02;
  GLint i_03;
  ulong uVar5;
  long lVar6;
  char *this_00;
  uint uVar7;
  string varying;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transform_feedback_varyings;
  string local_1f8;
  Functions *local_1d8;
  ulong local_1d0;
  vector<const_char_*,_std::allocator<const_char_*>_> transform_feedback_varyings_c;
  string transform_feedback_variable_declarations;
  string vertex_shader;
  string transform_feedback_variable_setters;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertex_shader,s_vertex_shader_source_code_template,
             (allocator<char> *)&transform_feedback_variable_declarations);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&transform_feedback_variable_declarations,
             glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&transform_feedback_variable_setters);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&transform_feedback_variable_setters,glcts::fixed_sample_locations_values + 1
             ,(allocator<char> *)&varying);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&transform_feedback_varyings,(long)this->m_max_transform_feedback_components,
           (allocator_type *)&varying);
  local_1d8 = (Functions *)CONCAT44(extraout_var,iVar1);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&transform_feedback_varyings_c,(long)this->m_max_transform_feedback_components,
             (allocator_type *)&varying);
  iVar1 = this->m_max_transform_feedback_components / 4;
  uVar2 = iVar1 - 1;
  lVar6 = 0;
  local_1d0 = 0;
  if (0 < (int)uVar2) {
    local_1d0 = (ulong)uVar2;
  }
  uVar7 = 3;
  for (uVar5 = 0; local_1d0 != uVar5; uVar5 = uVar5 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&varying,"result_",(allocator<char> *)&local_1f8);
    Utilities::itoa_abi_cxx11_(&local_1f8,(Utilities *)(uVar5 & 0xffffffff),i);
    std::__cxx11::string::append((string *)&varying);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)&((transform_feedback_varyings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6));
    transform_feedback_varyings_c.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar5] =
         *(char **)((long)&((transform_feedback_varyings.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6);
    std::__cxx11::string::append((char *)&transform_feedback_variable_declarations);
    std::__cxx11::string::append((string *)&transform_feedback_variable_declarations);
    std::__cxx11::string::append((char *)&transform_feedback_variable_declarations);
    std::__cxx11::string::append((char *)&transform_feedback_variable_setters);
    std::__cxx11::string::append((string *)&transform_feedback_variable_setters);
    std::__cxx11::string::append((char *)&transform_feedback_variable_setters);
    Utilities::itoa_abi_cxx11_(&local_1f8,(Utilities *)(ulong)(uVar7 - 3),i_00);
    std::__cxx11::string::append((string *)&transform_feedback_variable_setters);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::append((char *)&transform_feedback_variable_setters);
    Utilities::itoa_abi_cxx11_(&local_1f8,(Utilities *)(ulong)(uVar7 - 2),i_01);
    std::__cxx11::string::append((string *)&transform_feedback_variable_setters);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::append((char *)&transform_feedback_variable_setters);
    Utilities::itoa_abi_cxx11_(&local_1f8,(Utilities *)(ulong)(uVar7 - 1),i_02);
    std::__cxx11::string::append((string *)&transform_feedback_variable_setters);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::append((char *)&transform_feedback_variable_setters);
    Utilities::itoa_abi_cxx11_(&local_1f8,(Utilities *)(ulong)uVar7,i_03);
    std::__cxx11::string::append((string *)&transform_feedback_variable_setters);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::append((char *)&transform_feedback_variable_setters);
    std::__cxx11::string::~string((string *)&varying);
    uVar7 = uVar7 + 4;
    lVar6 = lVar6 + 0x20;
  }
  std::__cxx11::string::assign
            ((char *)(transform_feedback_varyings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (int)uVar2));
  transform_feedback_varyings_c.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start[(int)uVar2] =
       transform_feedback_varyings.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[(int)uVar2]._M_dataplus._M_p;
  std::__cxx11::string::string((string *)&local_50,(string *)&vertex_shader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"TEMPLATE_INPUT_OUTPUT_DECLARATIONS",(allocator<char> *)&local_1f8)
  ;
  std::__cxx11::string::string
            ((string *)&local_90,(string *)&transform_feedback_variable_declarations);
  Utilities::preprocessCode(&varying,&local_50,&local_70,&local_90);
  std::__cxx11::string::operator=((string *)&vertex_shader,(string *)&varying);
  std::__cxx11::string::~string((string *)&varying);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_b0,(string *)&vertex_shader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"TEMPLATE_OUTPUT_SETTERS",(allocator<char> *)&local_1f8);
  std::__cxx11::string::string((string *)&local_f0,(string *)&transform_feedback_variable_setters);
  Utilities::preprocessCode(&varying,&local_b0,&local_d0,&local_f0);
  std::__cxx11::string::operator=((string *)&vertex_shader,(string *)&varying);
  std::__cxx11::string::~string((string *)&varying);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_110,(string *)&vertex_shader);
  this_00 = "TEMPLATE_RASTERIZATION_EPSILON";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"TEMPLATE_RASTERIZATION_EPSILON",(allocator<char> *)&local_1f8);
  Utilities::ftoa_abi_cxx11_(&local_150,(Utilities *)this_00,0.0625);
  Utilities::preprocessCode(&varying,&local_110,&local_130,&local_150);
  std::__cxx11::string::operator=((string *)&vertex_shader,(string *)&varying);
  std::__cxx11::string::~string((string *)&varying);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  GVar3 = Utilities::buildProgram
                    (local_1d8,this->m_context->m_testCtx->m_log,(GLchar *)0x0,(GLchar *)0x0,
                     (GLchar *)0x0,vertex_shader._M_dataplus._M_p,s_fragment_shader_source_code,
                     transform_feedback_varyings_c.
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start,iVar1,this->m_attrib_type,false,(GLint *)0x0);
  this->m_program = GVar3;
  if (GVar3 != 0) {
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&transform_feedback_varyings_c.
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&transform_feedback_varyings);
    std::__cxx11::string::~string((string *)&transform_feedback_variable_setters);
    std::__cxx11::string::~string((string *)&transform_feedback_variable_declarations);
    std::__cxx11::string::~string((string *)&vertex_shader);
    return;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

void gl3cts::TransformFeedback::CaptureVertexInterleaved::buildProgram(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Preparing source code. */
	std::string vertex_shader(s_vertex_shader_source_code_template); /* Storage for vertex shader source code. */
	std::string transform_feedback_variable_declarations(
		""); /* String to contain all custom outputs from vertex shader. */
	std::string transform_feedback_variable_setters(
		""); /* String containing all initializations of custom outputs from vertex shader. */
	std::vector<std::string> transform_feedback_varyings(m_max_transform_feedback_components); /* Varyings array. */
	std::vector<const glw::GLchar*> transform_feedback_varyings_c(
		m_max_transform_feedback_components); /* Varyings array in C form to pass to the GL. */

	glw::GLint user_defined_transform_feedback_interleaved_varyings_count =
		m_max_transform_feedback_components /* total max to be written by the shader */
			/ 4								/* components per vec4 */
		- 1 /* gl_Position */;

	glw::GLint all_transform_feedback_interleaved_varyings_count =
		user_defined_transform_feedback_interleaved_varyings_count + 1 /* gl_Position */;

	/* Most of varyings is declarated output variables. */
	for (glw::GLint i = 0; i < user_defined_transform_feedback_interleaved_varyings_count; ++i)
	{
		std::string varying = "result_";
		varying.append(gl3cts::TransformFeedback::Utilities::itoa(i));

		transform_feedback_varyings[i] = varying;

		transform_feedback_varyings_c[i] = transform_feedback_varyings[i].c_str();

		transform_feedback_variable_declarations.append("out vec4 ");
		transform_feedback_variable_declarations.append(varying);
		transform_feedback_variable_declarations.append(";\n");

		transform_feedback_variable_setters.append("    ");
		transform_feedback_variable_setters.append(varying);
		transform_feedback_variable_setters.append(" = vec4(");
		transform_feedback_variable_setters.append(gl3cts::TransformFeedback::Utilities::itoa(i * 4));
		transform_feedback_variable_setters.append(".0, ");
		transform_feedback_variable_setters.append(gl3cts::TransformFeedback::Utilities::itoa(i * 4 + 1));
		transform_feedback_variable_setters.append(".0, ");
		transform_feedback_variable_setters.append(gl3cts::TransformFeedback::Utilities::itoa(i * 4 + 2));
		transform_feedback_variable_setters.append(".0, ");
		transform_feedback_variable_setters.append(gl3cts::TransformFeedback::Utilities::itoa(i * 4 + 3));
		transform_feedback_variable_setters.append(".0);\n");
	}

	/* Last four varying components are gl_Position components. */
	transform_feedback_varyings[user_defined_transform_feedback_interleaved_varyings_count] = "gl_Position";

	transform_feedback_varyings_c[user_defined_transform_feedback_interleaved_varyings_count] =
		transform_feedback_varyings[user_defined_transform_feedback_interleaved_varyings_count].c_str();

	/* Preprocess vertex shader source code template. */
	vertex_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(
		vertex_shader, "TEMPLATE_INPUT_OUTPUT_DECLARATIONS", transform_feedback_variable_declarations);
	vertex_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(vertex_shader, "TEMPLATE_OUTPUT_SETTERS",
																		 transform_feedback_variable_setters);
	vertex_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(
		vertex_shader, "TEMPLATE_RASTERIZATION_EPSILON",
		gl3cts::TransformFeedback::Utilities::ftoa(s_rasterization_epsilon));

	/* Compile, link and check. */
	m_program = gl3cts::TransformFeedback::Utilities::buildProgram(
		gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, vertex_shader.c_str(), s_fragment_shader_source_code,
		&transform_feedback_varyings_c[0], all_transform_feedback_interleaved_varyings_count, m_attrib_type);

	if (0 == m_program)
	{
		throw 0;
	}
}